

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int processCommandLine(int argc,char **argv,opt_t *opt)

{
  int iVar1;
  string *in_RDX;
  long in_RSI;
  undefined4 in_EDI;
  int opt_idx;
  int longIndex;
  int requiredArgument;
  int noArgument;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  string *local_18;
  long local_10;
  undefined4 local_4;
  
  local_1c = 0;
  local_20 = 1;
  local_24 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  while (iVar1 = getopt_long_only(local_4,local_10,"",processCommandLine::s_longOptions,&local_24),
        iVar1 != -1) {
    switch(iVar1) {
    case 0:
      showHelp();
      exit(0);
    case 1:
      std::__cxx11::string::operator=(local_18,_optarg);
      break;
    case 2:
      std::__cxx11::string::operator=(local_18 + 0x20,_optarg);
      break;
    case 3:
      std::__cxx11::string::operator=(local_18 + 0x80,_optarg);
      break;
    case 4:
      std::__cxx11::string::operator=(local_18 + 0x40,_optarg);
      break;
    case 5:
      std::__cxx11::string::operator=(local_18 + 0x60,_optarg);
      break;
    case 6:
      std::__cxx11::string::operator=(local_18 + 0xa0,_optarg);
      break;
    default:
      fprintf(_stderr,"Invalid argument passed: %s",
              *(undefined8 *)(local_10 + (long)(_optind + -1) * 8));
      showHelp();
      exit(-1);
    }
  }
  return 0;
}

Assistant:

int processCommandLine(int argc, char** argv, opt_t &opt) 
{
    enum OPTIONS 
    {
        OPT_HELP = 0,
        OPT_IN_FILE,
        OPT_OUT_VIDEO,
        OPT_OUT_IMAGE,
        OPT_DETECTOR,
        OPT_EFFECT,
        OPT_TARGET
    };

    const int noArgument = 0;
    const int requiredArgument = 1;

    static struct option s_longOptions[] = 
    {
            {"help",             noArgument,       NULL, OPT_HELP},
            {"file",             requiredArgument, NULL, OPT_IN_FILE},
            {"video",            requiredArgument, NULL, OPT_OUT_VIDEO},
            {"image",            requiredArgument, NULL, OPT_OUT_IMAGE},
            {"detector",         requiredArgument, NULL, OPT_DETECTOR},
            {"effect",           requiredArgument, NULL, OPT_EFFECT},
            {"target",           requiredArgument, NULL, OPT_TARGET},
            {NULL, 0, NULL, 0}
    };

    int longIndex = 0;
    int opt_idx = 0;

    while ((opt_idx = getopt_long_only(argc, argv, "", s_longOptions, &longIndex)) != -1) 
    {
        switch (opt_idx) 
        {
            case OPT_HELP:
                showHelp();
                std::exit(0);
            case OPT_IN_FILE:
                opt.filePath = optarg;
                break;
            case OPT_OUT_VIDEO:
                opt.video = optarg;
                break;
            case OPT_OUT_IMAGE:
                opt.image = optarg;
                break;
            case OPT_DETECTOR:
                opt.detector = optarg;
                break;
            case OPT_EFFECT:
                opt.effect = optarg;
                break;
            case OPT_TARGET:
                opt.target = optarg;
                break;
            default:
                fprintf(stderr, "Invalid argument passed: %s", argv[optind - 1]);
                showHelp();
                std::exit(-1);
        }
    }

    return 0;
}